

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickpool.hpp
# Opt level: O2

void __thiscall quickpool::ThreadPool::set_thread_affinity(ThreadPool *this)

{
  ulong uVar1;
  int iVar2;
  reference pvVar3;
  runtime_error *this_00;
  ulong __n;
  vector<unsigned_long,_std::allocator<unsigned_long>_> avail_cores;
  cpu_set_t cpuset;
  
  sched::get_avail_cores();
  __n = 0;
  do {
    if ((ulong)((long)(this->workers_).super__Vector_base<std::thread,_std::allocator<std::thread>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->workers_).super__Vector_base<std::thread,_std::allocator<std::thread>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) {
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&avail_cores.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      return;
    }
    cpuset.__bits[0xe] = 0;
    cpuset.__bits[0xf] = 0;
    cpuset.__bits[0xc] = 0;
    cpuset.__bits[0xd] = 0;
    cpuset.__bits[10] = 0;
    cpuset.__bits[0xb] = 0;
    cpuset.__bits[8] = 0;
    cpuset.__bits[9] = 0;
    cpuset.__bits[6] = 0;
    cpuset.__bits[7] = 0;
    cpuset.__bits[4] = 0;
    cpuset.__bits[5] = 0;
    cpuset.__bits[2] = 0;
    cpuset.__bits[3] = 0;
    cpuset.__bits[0] = 0;
    cpuset.__bits[1] = 0;
    uVar1 = avail_cores.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start
            [__n % (ulong)((long)avail_cores.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)avail_cores.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3)];
    if (uVar1 < 0x400) {
      cpuset.__bits[uVar1 >> 6] = cpuset.__bits[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f);
    }
    pvVar3 = std::vector<std::thread,_std::allocator<std::thread>_>::at(&this->workers_,__n);
    iVar2 = pthread_setaffinity_np((pvVar3->_M_id)._M_thread,0x80,(cpu_set_t *)&cpuset);
    __n = __n + 1;
  } while (iVar2 == 0);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Error calling pthread_setaffinity_np");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void set_thread_affinity()
    {
        cpu_set_t cpuset;
        auto avail_cores = sched::get_avail_cores();
        for (size_t id = 0; id < workers_.size(); id++) {
            CPU_ZERO(&cpuset);
            CPU_SET(avail_cores[id % avail_cores.size()], &cpuset);
            int rc = pthread_setaffinity_np(
              workers_.at(id).native_handle(), sizeof(cpu_set_t), &cpuset);
            if (rc != 0) {
                throw std::runtime_error(
                  "Error calling pthread_setaffinity_np");
            }
        }
    }